

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astWhileContinueWithNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t value;
  _Bool local_59;
  undefined1 local_58 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_astWhileContinueWithNode_t **whileNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  local_58 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sourcePositionRecord.sourcePosition = (sysbvm_tuple_t)arguments;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_58);
  while( true ) {
    local_59 = true;
    if (*(long *)(*(long *)sourcePositionRecord.sourcePosition + 0x28) != 0) {
      value = sysbvm_interpreter_evaluateASTWithEnvironment
                        (context,*(sysbvm_tuple_t *)
                                  (*(long *)sourcePositionRecord.sourcePosition + 0x28),*psVar1);
      local_59 = sysbvm_tuple_boolean_decode(value);
    }
    if (local_59 == false) break;
    if (*(long *)(*(long *)sourcePositionRecord.sourcePosition + 0x30) != 0) {
      sysbvm_interpreter_evaluateASTWithEnvironment
                (context,*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x30),
                 *psVar1);
    }
    if (*(long *)(*(long *)sourcePositionRecord.sourcePosition + 0x38) != 0) {
      sysbvm_interpreter_evaluateASTWithEnvironment
                (context,*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x38),
                 *psVar1);
    }
    sysbvm_gc_safepoint(context);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_58);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_astWhileContinueWithNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astWhileContinueWithNode_t **whileNode = (sysbvm_astWhileContinueWithNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*whileNode)->super.sourcePosition);
    while(!(*whileNode)->conditionExpression
        || sysbvm_tuple_boolean_decode(sysbvm_interpreter_evaluateASTWithEnvironment(context, (*whileNode)->conditionExpression, *environment)))
    {
        if((*whileNode)->bodyExpression)
            sysbvm_interpreter_evaluateASTWithEnvironment(context, (*whileNode)->bodyExpression, *environment);

        if((*whileNode)->continueExpression)
            sysbvm_interpreter_evaluateASTWithEnvironment(context, (*whileNode)->continueExpression, *environment);

        sysbvm_gc_safepoint(context);
    }
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);

    return SYSBVM_VOID_TUPLE;
}